

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O0

boolean make_hallucinated(long xtime,boolean talk,long mask)

{
  uint uVar1;
  char *line;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *local_168;
  int local_154;
  char local_148 [4];
  int eyecnt;
  char buf [256];
  char *verb;
  char *message;
  boolean changed;
  long old;
  long mask_local;
  boolean talk_local;
  long xtime_local;
  
  uVar1 = u.uprops[0x23].intrinsic;
  message._7_1_ = false;
  line = "Oh wow!  Everything %s so cosmic!";
  if (xtime == 0) {
    line = "Everything %s SO boring now.";
  }
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    bVar4 = false;
    if (ublindf != (obj *)0x0) {
      bVar4 = ublindf->oartifact == '\x1d';
    }
    bVar4 = (bool)(bVar4 ^ 1);
  }
  pcVar2 = "feels";
  if (!bVar4) {
    pcVar2 = "looks";
  }
  if (mask == 0) {
    if ((u.uprops[0x24].extrinsic == 0) && ((u.uprops[0x23].intrinsic != 0) != (xtime != 0))) {
      message._7_1_ = true;
    }
    set_itimeout(&u.uprops[0x23].intrinsic,xtime);
    if (((message._7_1_ == false) && (u.uprops[0x23].intrinsic == 0)) &&
       ((uVar1 != 0 && (talk != '\0')))) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
          pline("Your vision seems to %s for a moment but is %s now.","flatten","normal");
        }
        else {
          if (((youmonst.data)->mflags1 & 0x1000) == 0) {
            local_154 = 2;
            if (youmonst.data == mons + 0x17b || youmonst.data == mons + 0x1e) {
              local_154 = 1;
            }
          }
          else {
            local_154 = 0;
          }
          pcVar3 = body_part(1);
          strcpy(local_148,pcVar3);
          if (local_154 == 1) {
            local_168 = local_148;
          }
          else {
            local_168 = makeplural(local_148);
          }
          pcVar3 = "twitch";
          if (local_154 == 1) {
            pcVar3 = "twitches";
          }
          pline("Your %s momentarily %s.",local_168,pcVar3 + 2);
        }
      }
      else {
        strange_feeling((obj *)0x0,(char *)0x0);
      }
    }
  }
  else {
    message._7_1_ = u.uprops[0x23].intrinsic != 0;
    if (xtime == 0) {
      u.uprops[0x24].extrinsic = u.uprops[0x24].extrinsic | (uint)mask;
    }
    else {
      u.uprops[0x24].extrinsic = u.uprops[0x24].extrinsic & ((uint)mask ^ 0xffffffff);
    }
  }
  if (message._7_1_ != false) {
    if ((u._1052_1_ & 1) == 0) {
      see_monsters();
      see_objects();
      see_traps();
    }
    else {
      swallowed(0);
    }
    update_inventory();
    iflags.botl = '\x01';
    if (talk != '\0') {
      pline(line,pcVar2);
    }
  }
  return message._7_1_;
}

Assistant:

boolean make_hallucinated(long xtime, /* nonzero if this is an attempt to turn on hallucination */
			  boolean talk,
			  long mask)  /* nonzero if resistance status should change by mask */
{
	long old = HHallucination;
	boolean changed = 0;
	const char *message, *verb;

	message = (!xtime) ? "Everything %s SO boring now." :
			     "Oh wow!  Everything %s so cosmic!";
	verb = (!Blind) ? "looks" : "feels";

	if (mask) {
	    if (HHallucination) changed = TRUE;

	    if (!xtime) EHalluc_resistance |= mask;
	    else EHalluc_resistance &= ~mask;
	} else {
	    if (!EHalluc_resistance && (!!HHallucination != !!xtime))
		changed = TRUE;
	    set_itimeout(&HHallucination, xtime);

	    /* clearing temporary hallucination without toggling vision */
	    if (!changed && !HHallucination && old && talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blind) {
		    char buf[BUFSZ];
		    int eyecnt = eyecount(youmonst.data);

		    strcpy(buf, body_part(EYE));
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "itches" : "itch");
		} else {	/* Grayswandir */
		    pline(vismsg, "flatten", "normal");
		}
	    }
	}

	if (changed) {
	    if (u.uswallow) {
		swallowed(0);	/* redraw swallow display */
	    } else {
		/* The see_* routines should be called *before* the pline. */
		see_monsters();
		see_objects();
		see_traps();
	    }

	    /* for perm_inv and anything similar
	    (eg. Qt windowport's equipped items display) */
	    update_inventory();

	    iflags.botl = 1;
	    if (talk) pline(message, verb);
	}
	return changed;
}